

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetCurrentState(void *cvode_mem,N_Vector *y)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x51d,"CVodeGetCurrentState",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    *y = *(N_Vector *)((long)cvode_mem + 0xd0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetCurrentState(void* cvode_mem, N_Vector* y)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *y = cv_mem->cv_y;

  return (CV_SUCCESS);
}